

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  ImDrawCmd *pIVar1;
  long lVar2;
  
  lVar2 = (long)(this->CmdBuffer).Size;
  pIVar1 = (this->CmdBuffer).Data + lVar2 + -1;
  if (lVar2 == 0) {
    pIVar1 = (ImDrawCmd *)0x0;
  }
  if (((pIVar1 == (ImDrawCmd *)0x0) || (pIVar1->ElemCount != 0)) ||
     (pIVar1->UserCallback != (ImDrawCallback)0x0)) {
    AddDrawCmd(this);
    pIVar1 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
  }
  pIVar1->UserCallback = callback;
  pIVar1->UserCallbackData = callback_data;
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}